

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

bool __thiscall deqp::UniformBlockCase::render(UniformBlockCase *this,ShaderProgram *program)

{
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TestLog *this_00;
  RenderContext *pRVar7;
  deUint32 extraout_var;
  char *str;
  undefined4 extraout_var_00;
  MessageBuilder *pMVar8;
  MessageBuilder local_400;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  LogImage local_230;
  RGBA local_1a0;
  RGBA local_19c;
  int local_198;
  int local_194;
  int x;
  int y;
  int local_164;
  undefined1 local_160 [4];
  int numFailedPixels;
  Surface pixels;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  VertexArrayBinding posArray;
  deUint16 indices [6];
  float position [16];
  int viewportY;
  int viewportX;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  Random rnd;
  Functions *gl;
  TestLog *log;
  ShaderProgram *program_local;
  UniformBlockCase *this_local;
  RenderTarget *this_01;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  rnd.m_rnd.z = (*pRVar7->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&renderTarget,dVar2);
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[4])();
  this_01 = (RenderTarget *)CONCAT44(extraout_var_00,iVar3);
  iVar3 = tcu::RenderTarget::getWidth(this_01);
  iVar3 = de::min<int>(iVar3,0x80);
  iVar4 = tcu::RenderTarget::getHeight(this_01);
  iVar4 = de::min<int>(iVar4,0x80);
  iVar5 = tcu::RenderTarget::getWidth(this_01);
  iVar5 = de::Random::getInt((Random *)&renderTarget,0,iVar5 - iVar3);
  iVar6 = tcu::RenderTarget::getHeight(this_01);
  iVar6 = de::Random::getInt((Random *)&renderTarget,0,iVar6 - iVar4);
  indices[4] = 0;
  indices[5] = 0xbf80;
  posArray.pointer.data = (void *)0x2000200010000;
  indices[0] = 1;
  indices[1] = 3;
  (**(code **)(rnd.m_rnd._8_8_ + 0x1a00))(iVar5,iVar6,iVar3,iVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"a_position",&local_129);
  glu::va::Float((VertexArrayBinding *)local_108,&local_128,4,4,0,(float *)(indices + 4));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  dVar2 = glu::ShaderProgram::getProgram(program);
  glu::pr::Triangles((PrimitiveList *)&pixels.m_pixels.m_cap,6,(deUint16 *)&posArray.pointer.data);
  glu::draw(pRVar7,dVar2,1,(VertexArrayBinding *)local_108,(PrimitiveList *)&pixels.m_pixels.m_cap,
            (DrawUtilCallback *)0x0);
  dVar2 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar2,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                  ,0x75d);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_108);
  tcu::Surface::Surface((Surface *)local_160,iVar3,iVar4);
  local_164 = 0;
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&x,(Surface *)local_160);
  glu::readPixels(pRVar7,iVar5,iVar6,(PixelBufferAccess *)&x);
  dVar2 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar2,"Reading pixels failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                  ,0x766);
  for (local_194 = 0; iVar3 = local_194, iVar4 = tcu::Surface::getHeight((Surface *)local_160),
      iVar3 < iVar4; local_194 = local_194 + 1) {
    for (local_198 = 0; iVar3 = local_198, iVar4 = tcu::Surface::getWidth((Surface *)local_160),
        iVar3 < iVar4; local_198 = local_198 + 1) {
      local_19c = tcu::Surface::getPixel((Surface *)local_160,local_198,local_194);
      local_1a0 = tcu::RGBA::white();
      bVar1 = tcu::RGBA::operator!=(&local_19c,&local_1a0);
      if (bVar1) {
        local_164 = local_164 + 1;
      }
    }
  }
  if (0 < local_164) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Image",&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"Rendered image",&local_279);
    tcu::LogImage::LogImage
              (&local_230,&local_250,&local_278,(Surface *)local_160,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::TestLog::operator<<(this_00,&local_230);
    tcu::LogImage::~LogImage(&local_230);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    tcu::TestLog::operator<<(&local_400,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_400,(char (*) [30])"Image comparison failed, got ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_164);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])" non-white pixels");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_400);
  }
  bVar1 = local_164 == 0;
  tcu::Surface::~Surface((Surface *)local_160);
  de::Random::~Random((Random *)&renderTarget);
  return bVar1;
}

Assistant:

bool UniformBlockCase::render(glu::ShaderProgram& program) const
{
	tcu::TestLog&			 log = m_testCtx.getLog();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	de::Random				 rnd(deStringHash(getName()));
	const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
	const int				 viewportW	= de::min(renderTarget.getWidth(), 128);
	const int				 viewportH	= de::min(renderTarget.getHeight(), 128);
	const int				 viewportX	= rnd.getInt(0, renderTarget.getWidth() - viewportW);
	const int				 viewportY	= rnd.getInt(0, renderTarget.getHeight() - viewportH);

	// Draw
	{
		const float position[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, +1.0f, 0.0f, 1.0f,
								   +1.0f, -1.0f, 0.0f, 1.0f, +1.0f, +1.0f, 0.0f, 1.0f };
		const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

		gl.viewport(viewportX, viewportY, viewportW, viewportH);

		glu::VertexArrayBinding posArray = glu::va::Float("a_position", 4, 4, 0, &position[0]);
		glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posArray,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	// Verify that all pixels are white.
	{
		tcu::Surface pixels(viewportW, viewportH);
		int			 numFailedPixels = 0;

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, pixels.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

		for (int y = 0; y < pixels.getHeight(); y++)
		{
			for (int x = 0; x < pixels.getWidth(); x++)
			{
				if (pixels.getPixel(x, y) != tcu::RGBA::white())
					numFailedPixels += 1;
			}
		}

		if (numFailedPixels > 0)
		{
			log << TestLog::Image("Image", "Rendered image", pixels);
			log << TestLog::Message << "Image comparison failed, got " << numFailedPixels << " non-white pixels"
				<< TestLog::EndMessage;
		}

		return numFailedPixels == 0;
	}
}